

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O3

void Int24_To_Int16(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                   int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  uchar *src;
  undefined2 *puVar1;
  PaInt16 *dest;
  
  if (count != 0) {
    puVar1 = (undefined2 *)((long)sourceBuffer + 1);
    do {
      *(undefined2 *)destinationBuffer = *puVar1;
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 2);
      puVar1 = (undefined2 *)((long)puVar1 + (long)(sourceStride * 3));
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Int24_To_Int16(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src = (unsigned char*)sourceBuffer;
    PaInt16 *dest = (PaInt16*)destinationBuffer;

    PaInt16 temp;

    (void) ditherGenerator; /* unused parameter */

    while( count-- )
    {

#if defined(PA_LITTLE_ENDIAN)
        /* src[0] is discarded */
        temp = (((PaInt16)src[1]));
        temp = temp | (PaInt16)(((PaInt16)src[2]) << 8);
#elif defined(PA_BIG_ENDIAN)
        /* src[2] is discarded */
        temp = (PaInt16)(((PaInt16)src[0]) << 8);
        temp = temp | (((PaInt16)src[1]));
#endif

        *dest = temp;

        src += sourceStride * 3;
        dest += destinationStride;
    }
}